

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void pop_sorted_suite::pop_alternating(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  undefined1 local_78 [8];
  array<int,_4UL> expect_3;
  array<int,_4UL> expect_2;
  array<int,_4UL> expect_1;
  array<int,_4UL> expect;
  int *first;
  iterator last;
  array<int,_4UL> storage;
  
  last = (iterator)0x160000000b;
  storage._M_elems[0] = 0x21;
  storage._M_elems[1] = 0x2c;
  pvVar1 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  expect._M_elems[2] = 0xb;
  register0x00000000 = vista::lower_bound_sorted<int*,int>(pvVar2,pvVar1,expect._M_elems + 2);
  vista::pop_sorted<int*>(register0x00000000,pvVar1);
  stack0xffffffffffffffc4 = 0x2100000016;
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0xb;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_1._M_elems + 3));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_1._M_elems + 3));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x565,"void pop_sorted_suite::pop_alternating()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  expect_1._M_elems[2] = 0x2c;
  register0x00000000 = vista::lower_bound_sorted<int*,int>(pvVar2,pvVar1 + -1,expect_1._M_elems + 2)
  ;
  vista::pop_sorted<int*>(register0x00000000,pvVar1 + -1);
  stack0xffffffffffffffb0 = 0x2100000016;
  expect_1._M_elems[0] = 0x2c;
  expect_1._M_elems[1] = 0xb;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_2._M_elems + 3));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_2._M_elems + 3));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x56d,"void pop_sorted_suite::pop_alternating()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  expect_2._M_elems[2] = 0x16;
  register0x00000000 = vista::lower_bound_sorted<int*,int>(pvVar2,pvVar1 + -2,expect_2._M_elems + 2)
  ;
  vista::pop_sorted<int*>(register0x00000000,pvVar1 + -2);
  stack0xffffffffffffff9c = 0x1600000021;
  expect_2._M_elems[0] = 0x2c;
  expect_2._M_elems[1] = 0xb;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_3._M_elems + 3));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_3._M_elems + 3));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x575,"void pop_sorted_suite::pop_alternating()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  expect_3._M_elems[2] = 0x21;
  register0x00000000 = vista::lower_bound_sorted<int*,int>(pvVar2,pvVar1 + -3,expect_3._M_elems + 2)
  ;
  vista::pop_sorted<int*>(register0x00000000,pvVar1 + -3);
  local_78._0_4_ = 0x21;
  local_78._4_4_ = 0x16;
  expect_3._M_elems[0] = 0x2c;
  expect_3._M_elems[1] = 0xb;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_78);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)local_78);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x57d,"void pop_sorted_suite::pop_alternating()",pvVar1,pvVar2,pvVar3,pvVar4);
  return;
}

Assistant:

void pop_alternating()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    auto last = storage.end();
    auto first = lower_bound_sorted(storage.begin(), last, 11);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 22, 33, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 44);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 22, 33, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 22);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 33, 22, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 33);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 33, 22, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}